

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getExtractionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var1;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *handleInfo;
  CommonCore *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  string *local_8;
  
  p_Var1 = getHandleInfo(in_stack_ffffffffffffffc8,
                         (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (p_Var1 == (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    local_8 = (string *)gEmptyString_abi_cxx11_;
  }
  else {
    switch((p_Var1->
           super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
           ._M_storage._M_storage.__data[4]) {
    case 'e':
    case 'i':
    case 'p':
      local_8 = (string *)
                &p_Var1[1].
                 super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ;
      break;
    case 'f':
      local_8 = (string *)p_Var1[3].super__Hash_node_base._M_nxt;
      break;
    default:
      local_8 = (string *)gEmptyString_abi_cxx11_;
    }
  }
  return local_8;
}

Assistant:

const std::string& CommonCore::getExtractionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::PUBLICATION:
            case InterfaceType::INPUT:
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_out;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}